

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall ncnn::Convolution::create_requantize_op(Convolution *this)

{
  float fVar1;
  Layer *pLVar2;
  reference ppLVar3;
  float *pfVar4;
  long in_RDI;
  Mat weights [1];
  ParamDict pd;
  float scale_out;
  float scale_in;
  int n;
  Mat *in_stack_fffffffffffff908;
  int in_stack_fffffffffffff910;
  int in_stack_fffffffffffff914;
  undefined4 in_stack_fffffffffffff918;
  int in_stack_fffffffffffff91c;
  ParamDict *in_stack_fffffffffffff920;
  size_type in_stack_fffffffffffff928;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *in_stack_fffffffffffff930;
  Mat *local_6b8;
  value_type in_stack_fffffffffffff950;
  Mat *local_690;
  undefined1 local_668 [80];
  Mat local_618;
  undefined1 auStack_5d8 [1468];
  float local_1c;
  float local_18;
  int local_14;
  int local_4;
  
  if ((*(byte *)(in_RDI + 0x1c1) & 1) == 0) {
    fprintf(_stderr,"requantized op set but use_int8_requantize disabled\n");
    local_4 = -1;
  }
  else {
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
              (in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x80); local_14 = local_14 + 1) {
      pLVar2 = create_layer(in_stack_fffffffffffff91c);
      ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x1e8)
                           ,(long)local_14);
      *ppLVar3 = pLVar2;
      local_18 = 1.0;
      local_1c = 1.0;
      pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x178),local_14);
      if ((*pfVar4 != 0.0) || (NAN(*pfVar4))) {
        fVar1 = *(float *)(in_RDI + 0x1b8);
        pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x178),local_14);
        local_18 = 1.0 / (fVar1 * *pfVar4);
      }
      else {
        local_18 = 0.0;
      }
      local_1c = *(float *)(in_RDI + 0x1bc);
      ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff950);
      ParamDict::set((ParamDict *)(auStack_5d8 + 0x18),0,local_18);
      ParamDict::set((ParamDict *)(auStack_5d8 + 0x18),1,local_1c);
      ParamDict::set((ParamDict *)(auStack_5d8 + 0x18),2,*(int *)(in_RDI + 0xa4));
      ParamDict::set((ParamDict *)(auStack_5d8 + 0x18),3,1);
      ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x1e8)
                           ,(long)local_14);
      (*(*ppLVar3)->_vptr_Layer[2])(*ppLVar3,auStack_5d8 + 0x18);
      local_690 = &local_618;
      do {
        Mat::Mat(local_690);
        local_690 = local_690 + 1;
      } while (local_690 != (Mat *)auStack_5d8);
      Mat::range((Mat *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
                 in_stack_fffffffffffff914,in_stack_fffffffffffff910);
      Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
                     (Mat *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
      Mat::~Mat((Mat *)0x14218f);
      ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x1e8)
                           ,(long)local_14);
      in_stack_fffffffffffff950 = *ppLVar3;
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)
                 CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                 in_stack_fffffffffffff908);
      (*in_stack_fffffffffffff950->_vptr_Layer[3])(in_stack_fffffffffffff950,local_668);
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff920,
                 (value_type_conflict *)
                 CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff920,
                 (value_type_conflict *)
                 CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
      local_6b8 = (Mat *)auStack_5d8;
      do {
        local_6b8 = local_6b8 + -1;
        Mat::~Mat((Mat *)0x142247);
      } while (local_6b8 != &local_618);
      ParamDict::~ParamDict(in_stack_fffffffffffff920);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Convolution::create_requantize_op(void)
{
    if (!use_int8_requantize)
    {
        fprintf(stderr, "requantized op set but use_int8_requantize disabled\n");
        return -1;
    }

    requantize_ops.resize(num_output);
    for (int n=0; n<num_output; n++)
    {
        requantize_ops[n] = ncnn::create_layer(ncnn::LayerType::Requantize);

        float scale_in = 1.f;
        float scale_out = 1.f;

        if (weight_data_int8_scales[n] == 0)
        {
            scale_in = 0;
        }
        else
        {
            scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[n]);
        }

        scale_out = top_blob_int8_scale;

        ncnn::ParamDict pd;
        pd.set(0, scale_in);   // scale in
        pd.set(1, scale_out);  // scale_out
        pd.set(2, bias_term);  // bias_term
        pd.set(3, 1);          // bias_data_size

        requantize_ops[n]->load_param(pd);

        ncnn::Mat weights[1];
        weights[0] = bias_data.range(n, 1);

        requantize_ops[n]->load_model(ModelBinFromMatArray(weights));

        requantize_scales.push_back(scale_in);
        requantize_scales.push_back(scale_out);
    }

    return 0;
}